

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TransformFeedback::CaptureGeometryInterleaved::fetchLimits(CaptureGeometryInterleaved *this)

{
  fetchLimits((CaptureGeometryInterleaved *)
              ((long)&this->_vptr_CaptureGeometryInterleaved +
              (long)this->_vptr_CaptureGeometryInterleaved[-7]));
  return;
}

Assistant:

void gl3cts::TransformFeedback::CaptureGeometryInterleaved::fetchLimits(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetching limits. */
	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS, &m_max_transform_feedback_components);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

	if (m_max_transform_feedback_components == 0)
	{
		throw 0;
	}

	glw::GLint max_geometry_total_components = 0;

	gl.getIntegerv(GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &max_geometry_total_components);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

	if (max_geometry_total_components == 0)
	{
		throw 0;
	}

	if (m_max_transform_feedback_components * 4 > max_geometry_total_components)
	{
		m_max_transform_feedback_components = max_geometry_total_components / 4;
	}
}